

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowStorageDevice::IfcFlowStorageDevice(IfcFlowStorageDevice *this)

{
  IfcFlowStorageDevice *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcDistributionFlowElement).field_0x168,"IfcFlowStorageDevice")
  ;
  IfcDistributionFlowElement::IfcDistributionFlowElement
            (&this->super_IfcDistributionFlowElement,&PTR_construction_vtable_24__00e1d568);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowStorageDevice,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowStorageDevice,_0UL> *)
             &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158,
             &PTR_construction_vtable_24__00e1d6f0);
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0xe1d410;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).field_0x168 = 0xe1d550;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xe1d438;
  (this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xe1d460;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xe1d488;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0xe1d4b0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x138 = 0xe1d4d8;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x148 = 0xe1d500;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158
       = 0xe1d528;
  return;
}

Assistant:

IfcFlowStorageDevice() : Object("IfcFlowStorageDevice") {}